

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O1

bool __thiscall QSQLiteResult::prepare(QSQLiteResult *this,QString *query)

{
  sqlite3_stmt **ppStmt;
  QSQLiteResultPrivate *this_00;
  QString *pQVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  long *plVar6;
  EVP_PKEY_CTX *ctx;
  char16_t *zSql;
  long in_FS_OFFSET;
  bool bVar7;
  void *pzTail;
  Db *local_90 [3];
  undefined1 local_78 [8];
  undefined1 local_70 [40];
  u64 local_48;
  QChar *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSQLiteResultPrivate **)&this->field_0x8;
  ctx = (EVP_PKEY_CTX *)query;
  lVar5 = QSqlResult::driver();
  if (lVar5 != 0) {
    plVar6 = (long *)QSqlResult::driver();
    cVar2 = (**(code **)(*plVar6 + 0x60))(plVar6);
    if (cVar2 != '\0') {
      QSqlResult::driver();
      cVar2 = QSqlDriver::isOpenError();
      if (cVar2 == '\0') {
        QSQLiteResultPrivate::cleanup(this_00,ctx);
        (**(code **)(*(long *)this + 0x38))(this,0);
        local_40 = (QChar *)0x0;
        zSql = (query->d).ptr;
        if (zSql == (char16_t *)0x0) {
          zSql = (char16_t *)&QString::_empty;
        }
        ppStmt = &this_00->stmt;
        iVar4 = sqlite3_prepare16_v2
                          (*(sqlite3 **)
                            (*(long *)(*(long *)&(this_00->super_QSqlCachedResultPrivate).field_0x18
                                      + 8) + 0xa8),zSql,(int)(query->d).size * 2 + 2,ppStmt,
                           &local_40);
        if (iVar4 == 0) {
          if (local_40 == (QChar *)0x0) {
            bVar7 = false;
          }
          else {
            QString::QString((QString *)local_70,local_40,-1);
            QString::trimmed_helper((QString *)(local_70 + 0x18));
            bVar7 = local_48 != 0;
            if ((Db *)local_70._24_8_ != (Db *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_70._24_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_70._24_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_70._24_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_70._24_8_,2,0x10);
              }
            }
            if ((Vdbe *)local_70._0_8_ != (Vdbe *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_70._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_70._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_70._0_8_)->_q_value).super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_70._0_8_,2,0x10);
              }
            }
          }
          bVar3 = true;
          if (!bVar7) goto LAB_0011338c;
          pQVar1 = *(QString **)
                    (*(long *)(*(long *)&(this_00->super_QSqlCachedResultPrivate).field_0x18 + 8) +
                    0xa8);
          QCoreApplication::translate
                    ((char *)local_90,"QSQLiteResult",
                     "Unable to execute multiple statements at a time",0);
          qMakeError((sqlite3 *)local_78,pQVar1,(ErrorType)local_90,2);
          (**(code **)(*(long *)this + 0x28))(this,(sqlite3 *)local_78);
          QSqlError::~QSqlError((QSqlError *)local_78);
          if (local_90[0] != (Db *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)&local_90[0]->zDbSName)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)&local_90[0]->zDbSName)->_q_value).super___atomic_base<int>.
                 _M_i + -1;
            iVar4 = (((QBasicAtomicInt *)&local_90[0]->zDbSName)->_q_value).super___atomic_base<int>
                    ._M_i;
            UNLOCK();
            goto joined_r0x00113360;
          }
        }
        else {
          pQVar1 = *(QString **)
                    (*(long *)(*(long *)&(this_00->super_QSqlCachedResultPrivate).field_0x18 + 8) +
                    0xa8);
          QCoreApplication::translate
                    (local_70 + 0x18,"QSQLiteResult","Unable to execute statement",0);
          qMakeError((sqlite3 *)local_70,pQVar1,(ErrorType)(local_70 + 0x18),2);
          (**(code **)(*(long *)this + 0x28))(this,(sqlite3 *)local_70);
          QSqlError::~QSqlError((QSqlError *)local_70);
          if ((Db *)local_70._24_8_ != (Db *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_70._24_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_70._24_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            iVar4 = (((QBasicAtomicInt *)local_70._24_8_)->_q_value).super___atomic_base<int>._M_i;
            UNLOCK();
            local_90[0] = (Db *)local_70._24_8_;
joined_r0x00113360:
            if (iVar4 == 0) {
              QArrayData::deallocate((QArrayData *)local_90[0],2,0x10);
            }
          }
        }
        if (*ppStmt != (sqlite3_stmt *)0x0) {
          sqlite3_finalize(*ppStmt);
          *ppStmt = (sqlite3_stmt *)0x0;
        }
      }
    }
  }
  bVar3 = false;
LAB_0011338c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool QSQLiteResult::prepare(const QString &query)
{
    Q_D(QSQLiteResult);
    if (!driver() || !driver()->isOpen() || driver()->isOpenError())
        return false;

    d->cleanup();

    setSelect(false);

    const void *pzTail = nullptr;
    const auto size = int((query.size() + 1) * sizeof(QChar));

#if (SQLITE_VERSION_NUMBER >= 3003011)
    int res = sqlite3_prepare16_v2(d->drv_d_func()->access, query.constData(), size,
                                   &d->stmt, &pzTail);
#else
    int res = sqlite3_prepare16(d->access, query.constData(), size,
                                &d->stmt, &pzTail);
#endif

    if (res != SQLITE_OK) {
        setLastError(qMakeError(d->drv_d_func()->access, QCoreApplication::translate("QSQLiteResult",
                     "Unable to execute statement"), QSqlError::StatementError, res));
        d->finalize();
        return false;
    } else if (pzTail && !QString(reinterpret_cast<const QChar *>(pzTail)).trimmed().isEmpty()) {
        setLastError(qMakeError(d->drv_d_func()->access, QCoreApplication::translate("QSQLiteResult",
            "Unable to execute multiple statements at a time"), QSqlError::StatementError, SQLITE_MISUSE));
        d->finalize();
        return false;
    }
    return true;
}